

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O2

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  uint uVar1;
  uint uVar2;
  long t;
  int iVar3;
  mode_t mVar4;
  mode_t mVar5;
  archive *paVar6;
  archive_entry *entry;
  time_t tVar7;
  ulong uVar8;
  int64_t iVar9;
  char *pcVar10;
  longlong lVar11;
  char *v1;
  ulong uVar12;
  wchar_t line;
  ssize_t v2;
  char *pcVar13;
  long lVar14;
  archive_entry *ae;
  int local_74;
  archive *local_70;
  size_t used;
  char *local_60;
  char local_58 [40];
  
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'©',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_mtree(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ª',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_mtree(a)",paVar6);
  local_74 = use_set;
  if (use_set != 0) {
    iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"use-set","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'¬',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_set_format_option(a, NULL, \"use-set\", \"1\")",paVar6);
  }
  if (dironly != 0) {
    iVar3 = archive_write_set_format_option(paVar6,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'®',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",paVar6);
  }
  iVar3 = archive_write_open_memory(paVar6,buff,0xfff,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar6);
  local_70 = paVar6;
  for (lVar14 = 0x1c; lVar14 != 0x17c; lVar14 = lVar14 + 0x20) {
    local_60 = *(char **)((long)&entries[0xb].path + lVar14 + 4);
    entry = archive_entry_new();
    ae = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'³',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    t = *(long *)((long)&entries[0xb].mtime + lVar14 + 4);
    archive_entry_set_mtime(entry,t,0);
    tVar7 = archive_entry_mtime(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'µ',(uint)(t == tVar7),"entries2[i].mtime == archive_entry_mtime(ae)",
                     (void *)0x0);
    mVar5 = *(mode_t *)(&entries[0xb].field_0xc + lVar14);
    archive_entry_set_mode(entry,mVar5);
    mVar4 = archive_entry_mode(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'·',(uint)(mVar5 == mVar4),"entries2[i].mode == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar12 = (ulong)*(uint *)((long)&entries[0xb].gid + lVar14);
    archive_entry_set_uid(entry,uVar12);
    uVar8 = archive_entry_uid(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¹',(uint)(uVar8 == uVar12),"entries2[i].uid == archive_entry_uid(ae)",
                     (void *)0x0);
    uVar12 = (ulong)*(uint *)((long)&entries2[0].path + lVar14);
    archive_entry_set_gid(entry,uVar12);
    uVar8 = archive_entry_gid(entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'»',(uint)(uVar8 == uVar12),"entries2[i].gid == archive_entry_gid(ae)",
                     (void *)0x0);
    archive_entry_copy_pathname(entry,local_60);
    paVar6 = local_70;
    if ((mVar5 & 0xf000) == 0x4000) {
      iVar3 = archive_write_header(local_70,entry);
      v2 = (ssize_t)iVar3;
      line = L'¿';
      lVar11 = 0;
      pcVar10 = "ARCHIVE_OK";
      pcVar13 = "archive_write_header(a, ae)";
    }
    else {
      lVar11 = 8;
      archive_entry_set_size(entry,8);
      paVar6 = local_70;
      iVar3 = archive_write_header(local_70,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'¿',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
      v2 = archive_write_data(paVar6,"Hello012",0xf);
      line = L'Â';
      pcVar10 = "8";
      pcVar13 = "archive_write_data(a, \"Hello012\", 15)";
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,line,lVar11,pcVar10,v2,pcVar13,paVar6);
    archive_entry_free(entry);
  }
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  if (local_74 != 0) {
    buff[used] = '\0';
    pcVar10 = strstr(buff,"\n/set ");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'Ì',(uint)(pcVar10 != (char *)0x0),
                     "NULL != (p = strstr(buff, \"\\n/set \"))",(void *)0x0);
    if (pcVar10 != (char *)0x0) {
      pcVar10 = pcVar10 + 1;
      pcVar13 = strchr(pcVar10,10);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (dironly == 0) {
          pcVar13 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'Ø',pcVar13,"o",pcVar10,"p",(void *)0x0,L'\0');
      }
      else {
        *pcVar13 = '\0';
        v1 = "/set type=dir uid=1001 gid=1001 mode=755";
        if (dironly == 0) {
          v1 = "/set type=file uid=1001 gid=1001 mode=644";
        }
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'Ø',v1,"o",pcVar10,"p",(void *)0x0,L'\0');
        *pcVar13 = '\n';
      }
    }
  }
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'á',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar6)
  ;
  iVar3 = archive_read_support_filter_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",paVar6)
  ;
  iVar3 = archive_read_open_memory(paVar6,buff,used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used)",
                      paVar6);
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '.';
  local_58[1] = '/';
  local_58[2] = 0;
  for (lVar14 = 0x1c; lVar14 != 0x17c; lVar14 = lVar14 + 0x20) {
    pcVar10 = *(char **)((long)&entries[0xb].path + lVar14 + 4);
    if ((dironly == 0) || ((*(uint *)(&entries[0xb].field_0xc + lVar14) & 0xf000) == 0x4000)) {
      iVar3 = archive_read_next_header(paVar6,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ì',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",
                          paVar6);
      lVar11 = *(longlong *)((long)&entries[0xb].mtime + lVar14 + 4);
      tVar7 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'í',lVar11,"entries2[i].mtime",tVar7,"archive_entry_mtime(ae)",
                          (void *)0x0);
      uVar1 = *(uint *)(&entries[0xb].field_0xc + lVar14);
      mVar5 = archive_entry_mode(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'î',(ulong)uVar1,"entries2[i].mode",(ulong)mVar5,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar2 = *(uint *)((long)&entries[0xb].gid + lVar14);
      iVar9 = archive_entry_uid(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ï',(ulong)uVar2,"entries2[i].uid",iVar9,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar2 = *(uint *)((long)&entries2[0].path + lVar14);
      iVar9 = archive_entry_gid(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ð',(ulong)uVar2,"entries2[i].gid",iVar9,"archive_entry_gid(ae)",
                          (void *)0x0);
      strcpy(local_58 + 2,pcVar10);
      pcVar10 = archive_entry_pathname(ae);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'ò',local_58,"str",pcVar10,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((uVar1 & 0xf000) != 0x4000) {
        iVar9 = archive_entry_size(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                            ,L'ô',8,"8",iVar9,"archive_entry_size(ae)",(void *)0x0);
      }
    }
  }
  iVar3 = archive_read_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'÷',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}